

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_uuid.c
# Opt level: O0

void uuid_generate_time(uchar *out)

{
  int iVar1;
  long lVar2;
  time_t tVar3;
  time_t now;
  uchar *out_local;
  
  lVar2 = __tls_get_addr(&PTR_00b7c390);
  if (0 < *(int *)(lVar2 + 8)) {
    tVar3 = time((time_t *)0x0);
    lVar2 = __tls_get_addr(&PTR_00b7c390);
    if (*(long *)(lVar2 + 0x20) + 1 < tVar3) {
      lVar2 = __tls_get_addr(&PTR_00b7c390);
      *(undefined4 *)(lVar2 + 8) = 0;
    }
  }
  lVar2 = __tls_get_addr(&PTR_00b7c390);
  if (*(int *)(lVar2 + 8) < 1) {
    lVar2 = __tls_get_addr(&PTR_00b7c390);
    *(undefined4 *)(lVar2 + 8) = 1000;
    lVar2 = __tls_get_addr(&PTR_00b7c390);
    iVar1 = get_uuid_via_daemon(4,out,(int *)(lVar2 + 8));
    if (iVar1 == 0) {
      tVar3 = time((time_t *)0x0);
      lVar2 = __tls_get_addr(&PTR_00b7c390);
      *(time_t *)(lVar2 + 0x20) = tVar3;
      lVar2 = __tls_get_addr(&PTR_00b7c390);
      uuid_unpack(out,(uuid *)(lVar2 + 0xc));
      lVar2 = __tls_get_addr(&PTR_00b7c390);
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + -1;
      return;
    }
    lVar2 = __tls_get_addr(&PTR_00b7c390);
    *(undefined4 *)(lVar2 + 8) = 0;
  }
  lVar2 = __tls_get_addr(&PTR_00b7c390);
  if (*(int *)(lVar2 + 8) < 1) {
    uuid__generate_time(out,(int *)0x0);
  }
  else {
    lVar2 = __tls_get_addr(&PTR_00b7c390);
    *(int *)(lVar2 + 0xc) = *(int *)(lVar2 + 0xc) + 1;
    lVar2 = __tls_get_addr(&PTR_00b7c390);
    if (*(int *)(lVar2 + 0xc) == 0) {
      lVar2 = __tls_get_addr(&PTR_00b7c390);
      *(short *)(lVar2 + 0x10) = *(short *)(lVar2 + 0x10) + 1;
      lVar2 = __tls_get_addr(&PTR_00b7c390);
      if (*(short *)(lVar2 + 0x10) == 0) {
        lVar2 = __tls_get_addr(&PTR_00b7c390);
        *(short *)(lVar2 + 0x12) = *(short *)(lVar2 + 0x12) + 1;
      }
    }
    lVar2 = __tls_get_addr(&PTR_00b7c390);
    *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + -1;
    lVar2 = __tls_get_addr(&PTR_00b7c390);
    uuid_pack((uuid *)(lVar2 + 0xc),out);
  }
  return;
}

Assistant:

void uuid_generate_time(uuid_t out)
{
#ifdef TLS
	THREAD_LOCAL int		num = 0;
	THREAD_LOCAL struct uuid	uu;
	THREAD_LOCAL time_t		last_time = 0;
	time_t				now;

	if (num > 0) {
		now = time(0);
		if (now > last_time+1)
			num = 0;
	}
	if (num <= 0) {
		num = 1000;
		if (get_uuid_via_daemon(UUIDD_OP_BULK_TIME_UUID,
					out, &num) == 0) {
			last_time = time(0);
			uuid_unpack(out, &uu);
			num--;
			return;
		}
		num = 0;
	}
	if (num > 0) {
		uu.time_low++;
		if (uu.time_low == 0) {
			uu.time_mid++;
			if (uu.time_mid == 0)
				uu.time_hi_and_version++;
		}
		num--;
		uuid_pack(&uu, out);
		return;
	}
#else
	if (get_uuid_via_daemon(UUIDD_OP_TIME_UUID, out, 0) == 0)
		return;
#endif

	uuid__generate_time(out, 0);
}